

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rescaler_sse2.c
# Opt level: O0

void LoadDispatchAndMult_SSE2
               (rescaler_t *src,__m128i *mult,__m128i *out0,__m128i *out1,__m128i *out2,
               __m128i *out3)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  __m128i A3;
  __m128i A2;
  __m128i A1;
  __m128i A0;
  __m128i *out3_local;
  __m128i *out2_local;
  __m128i *out1_local;
  __m128i *out0_local;
  __m128i *mult_local;
  rescaler_t *src_local;
  
  uVar1 = *(ulong *)src;
  uVar2 = *(ulong *)(src + 2);
  uVar3 = *(ulong *)(src + 4);
  uVar4 = *(ulong *)(src + 6);
  if (mult == (__m128i *)0x0) {
    (*out0)[0] = uVar1;
    (*out0)[1] = uVar2;
    (*out1)[0] = uVar3;
    (*out1)[1] = uVar4;
    (*out2)[0] = uVar1 >> 0x20;
    (*out2)[1] = uVar2 >> 0x20;
    (*out3)[0] = uVar3 >> 0x20;
    (*out3)[1] = uVar4 >> 0x20;
  }
  else {
    uVar5 = (*mult)[1];
    (*out0)[0] = (uVar1 & 0xffffffff) * ((*mult)[0] & 0xffffffffU);
    (*out0)[1] = (uVar2 & 0xffffffff) * (uVar5 & 0xffffffff);
    uVar5 = (*mult)[1];
    (*out1)[0] = (uVar3 & 0xffffffff) * ((*mult)[0] & 0xffffffffU);
    (*out1)[1] = (uVar4 & 0xffffffff) * (uVar5 & 0xffffffff);
    uVar5 = (*mult)[1];
    (*out2)[0] = (uVar1 >> 0x20) * ((*mult)[0] & 0xffffffffU);
    (*out2)[1] = (uVar2 >> 0x20) * (uVar5 & 0xffffffff);
    uVar1 = (*mult)[1];
    (*out3)[0] = (uVar3 >> 0x20) * ((*mult)[0] & 0xffffffffU);
    (*out3)[1] = (uVar4 >> 0x20) * (uVar1 & 0xffffffff);
  }
  return;
}

Assistant:

static WEBP_INLINE void LoadDispatchAndMult_SSE2(
    const rescaler_t* WEBP_RESTRICT const src, const __m128i* const mult,
    __m128i* const out0, __m128i* const out1, __m128i* const out2,
    __m128i* const out3) {
  const __m128i A0 = _mm_loadu_si128((const __m128i*)(src + 0));
  const __m128i A1 = _mm_loadu_si128((const __m128i*)(src + 4));
  const __m128i A2 = _mm_srli_epi64(A0, 32);
  const __m128i A3 = _mm_srli_epi64(A1, 32);
  if (mult != NULL) {
    *out0 = _mm_mul_epu32(A0, *mult);
    *out1 = _mm_mul_epu32(A1, *mult);
    *out2 = _mm_mul_epu32(A2, *mult);
    *out3 = _mm_mul_epu32(A3, *mult);
  } else {
    *out0 = A0;
    *out1 = A1;
    *out2 = A2;
    *out3 = A3;
  }
}